

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_checksum.cpp
# Opt level: O0

uint crnlib::adler32(void *pBuf,size_t buflen,uint adler32)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 local_50;
  unsigned_long i;
  size_t blocklen;
  unsigned_long s2;
  unsigned_long s1;
  unsigned_long ADLER_MOD;
  uint8 *buffer;
  size_t sStack_18;
  uint adler32_local;
  size_t buflen_local;
  void *pBuf_local;
  
  s2 = (unsigned_long)(adler32 & 0xffff);
  blocklen = (size_t)(adler32 >> 0x10);
  i = buflen % 0x15b0;
  ADLER_MOD = (unsigned_long)pBuf;
  sStack_18 = buflen;
  while (sStack_18 != 0) {
    for (local_50 = 0; local_50 + 7 < i; local_50 = local_50 + 8) {
      lVar1 = *(byte *)ADLER_MOD + s2;
      lVar2 = (ulong)*(byte *)(ADLER_MOD + 1) + lVar1;
      lVar3 = (ulong)*(byte *)(ADLER_MOD + 2) + lVar2;
      lVar4 = (ulong)*(byte *)(ADLER_MOD + 3) + lVar3;
      lVar5 = (ulong)*(byte *)(ADLER_MOD + 4) + lVar4;
      lVar6 = (ulong)*(byte *)(ADLER_MOD + 5) + lVar5;
      lVar7 = (ulong)*(byte *)(ADLER_MOD + 6) + lVar6;
      s2 = (ulong)*(byte *)(ADLER_MOD + 7) + lVar7;
      blocklen = s2 + lVar7 + lVar6 + lVar5 + lVar4 + lVar3 + lVar2 + lVar1 + blocklen;
      ADLER_MOD = ADLER_MOD + 8;
    }
    for (; local_50 < i; local_50 = local_50 + 1) {
      s2 = *(byte *)ADLER_MOD + s2;
      blocklen = s2 + blocklen;
      ADLER_MOD = ADLER_MOD + 1;
    }
    s2 = s2 % 0xfff1;
    blocklen = blocklen % 0xfff1;
    sStack_18 = sStack_18 - i;
    i = 0x15b0;
  }
  return (int)(blocklen << 0x10) + (int)s2;
}

Assistant:

uint adler32(const void* pBuf, size_t buflen, uint adler32) {
  const uint8* buffer = static_cast<const uint8*>(pBuf);

  const unsigned long ADLER_MOD = 65521;
  unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
  size_t blocklen;
  unsigned long i;

  blocklen = buflen % 5552;
  while (buflen) {
    for (i = 0; i + 7 < blocklen; i += 8) {
      s1 += buffer[0], s2 += s1;
      s1 += buffer[1], s2 += s1;
      s1 += buffer[2], s2 += s1;
      s1 += buffer[3], s2 += s1;
      s1 += buffer[4], s2 += s1;
      s1 += buffer[5], s2 += s1;
      s1 += buffer[6], s2 += s1;
      s1 += buffer[7], s2 += s1;

      buffer += 8;
    }

    for (; i < blocklen; ++i)
      s1 += *buffer++, s2 += s1;

    s1 %= ADLER_MOD, s2 %= ADLER_MOD;
    buflen -= blocklen;
    blocklen = 5552;
  }
  return (s2 << 16) + s1;
}